

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

void __thiscall leveldb::Block::Iter::SeekToLast(Iter *this)

{
  bool bVar1;
  uint32_t uVar2;
  
  uVar2 = this->num_restarts_ - 1;
  (this->key_)._M_string_length = 0;
  *(this->key_)._M_dataplus._M_p = '\0';
  this->restart_index_ = uVar2;
  uVar2 = GetRestartPoint(this,uVar2);
  (this->value_).data_ = this->data_ + uVar2;
  (this->value_).size_ = 0;
  do {
    bVar1 = ParseNextKey(this);
    if (!bVar1) {
      return;
    }
  } while ((uint)((*(int *)&(this->value_).data_ + (int)(this->value_).size_) - *(int *)&this->data_
                 ) < this->restarts_);
  return;
}

Assistant:

void SeekToLast() override {
    SeekToRestartPoint(num_restarts_ - 1);
    while (ParseNextKey() && NextEntryOffset() < restarts_) {
      // Keep skipping
    }
  }